

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_numeric_suite.cpp
# Opt level: O1

void inner_product_suite::test_overfull(void)

{
  bool bVar1;
  reference piVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  initializer_list<int> input;
  initializer_list<int> input_00;
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  basic_iterator<int> local_98;
  undefined4 local_88;
  iterator_type local_78;
  int local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  piVar3 = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_98.parent = (view_pointer)0x160000000b;
  local_98.current = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_98;
  local_50.member.data = piVar3;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input);
  local_78.current = local_50.member.cap * 2;
  uVar4 = local_78.current - (local_50.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_98.current = local_78.current - 1 & local_50.member.next - local_50.member.size;
  }
  else {
    local_98.current = (local_50.member.next - local_50.member.size) % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_78.current - 1 & local_50.member.next;
  }
  else {
    local_78.current = local_50.member.next % local_78.current;
  }
  local_98.parent = &local_50;
  local_78.parent = &local_50;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_98,&local_78);
  iVar5 = 0;
  if (!bVar1) {
    iVar5 = 0;
    do {
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_98);
      iVar5 = iVar5 + *piVar3 * *piVar2;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      piVar3 = piVar3 + 1;
      bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                        (&local_98,&local_78);
    } while (!bVar1);
  }
  local_98.parent = (view_pointer)CONCAT44(local_98.parent._4_4_,iVar5);
  local_78.parent = (view_pointer)CONCAT44(local_78.parent._4_4_,0xe2e);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::inner_product(span.begin(), span.end(), array.begin(), 0)",
             "11 * 11 + 22 * 22 + 33 * 33 + 44 * 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x34,"void inner_product_suite::test_overfull()",&local_98,&local_78);
  local_98.parent = (view_pointer)0x160000000b;
  local_98.current = 0x2c00000021;
  local_88 = 0x37;
  input_00._M_len = 5;
  input_00._M_array = (iterator)&local_98;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input_00);
  local_78.current = local_50.member.cap * 2;
  uVar4 = local_78.current - (local_50.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_98.current = local_78.current - 1 & local_50.member.next - local_50.member.size;
  }
  else {
    local_98.current = (local_50.member.next - local_50.member.size) % local_78.current;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_78.current - 1 & local_50.member.next;
  }
  else {
    local_78.current = local_50.member.next % local_78.current;
  }
  local_98.parent = &local_50;
  local_78.parent = &local_50;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_98,&local_78);
  iVar5 = 0;
  if (!bVar1) {
    piVar3 = local_68;
    iVar5 = 0;
    do {
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_98);
      iVar5 = iVar5 + *piVar3 * *piVar2;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      piVar3 = piVar3 + 1;
      bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                        (&local_98,&local_78);
    } while (!bVar1);
  }
  local_98.parent = (view_pointer)CONCAT44(local_98.parent._4_4_,iVar5);
  local_78.parent = (view_pointer)CONCAT44(local_78.parent._4_4_,0x16b0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::inner_product(span.begin(), span.end(), array.begin(), 0)",
             "22 * 55 + 33 * 22 + 44 * 33 + 55 * 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x37,"void inner_product_suite::test_overfull()",&local_98,&local_78);
  return;
}

Assistant:

void test_overfull()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span = { 11, 22, 33, 44 };
    BOOST_TEST_EQ(std::inner_product(span.begin(), span.end(), array.begin(), 0),
                  11 * 11 + 22 * 22 + 33 * 33 + 44 * 44);
    span = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(std::inner_product(span.begin(), span.end(), array.begin(), 0),
                  22 * 55 + 33 * 22 + 44 * 33 + 55 * 44);
}